

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3rbu_bp_progress(sqlite3rbu *p,int *pnOne,int *pnTwo)

{
  int MAX_PROGRESS;
  int *pnTwo_local;
  int *pnOne_local;
  sqlite3rbu *p_local;
  
  switch(p->eStage) {
  case 1:
    if (p->nPhaseOneStep < 1) {
      *pnOne = -1;
    }
    else {
      *pnOne = (int)(((long)p->nProgress * 10000) / p->nPhaseOneStep);
    }
    *pnTwo = 0;
    break;
  case 2:
    *pnOne = 10000;
    *pnTwo = 0;
    break;
  default:
    break;
  case 4:
    *pnOne = 10000;
    *pnTwo = (int)(((long)p->nStep * 10000) / (long)p->nFrame);
    break;
  case 5:
    *pnOne = 10000;
    *pnTwo = 10000;
  }
  return;
}

Assistant:

SQLITE_API void sqlite3rbu_bp_progress(sqlite3rbu *p, int *pnOne, int *pnTwo){
  const int MAX_PROGRESS = 10000;
  switch( p->eStage ){
    case RBU_STAGE_OAL:
      if( p->nPhaseOneStep>0 ){
        *pnOne = (int)(MAX_PROGRESS * (i64)p->nProgress/(i64)p->nPhaseOneStep);
      }else{
        *pnOne = -1;
      }
      *pnTwo = 0;
      break;

    case RBU_STAGE_MOVE:
      *pnOne = MAX_PROGRESS;
      *pnTwo = 0;
      break;

    case RBU_STAGE_CKPT:
      *pnOne = MAX_PROGRESS;
      *pnTwo = (int)(MAX_PROGRESS * (i64)p->nStep / (i64)p->nFrame);
      break;

    case RBU_STAGE_DONE:
      *pnOne = MAX_PROGRESS;
      *pnTwo = MAX_PROGRESS;
      break;

    default:
      assert( 0 );
  }
}